

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::copy_file(path *from,path *to,copy_options options,error_code *ec)

{
  bool bVar1;
  int iVar2;
  int __fd;
  error_category *peVar3;
  file_time_type fVar4;
  file_time_type fVar5;
  int *piVar6;
  void *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t __n;
  ssize_t sVar7;
  long lVar8;
  file_status st;
  file_status sf;
  error_code tect;
  error_code tecf;
  undefined1 local_68 [12];
  ushort local_5c;
  undefined1 local_58 [16];
  error_category *local_48;
  file_status local_40;
  error_category *peStack_38;
  
  local_40._type = none;
  peVar3 = (error_category *)std::_V2::system_category();
  local_58._8_4_ = 0;
  local_48 = peVar3;
  peStack_38 = peVar3;
  detail::status_ex((path *)(local_68 + 8),(error_code *)from,&local_40,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  detail::status_ex((path *)local_68,(error_code *)to,(file_status *)(local_58 + 8),(uintmax_t *)0x0
                    ,(uintmax_t *)0x0,(time_t *)0x0,0);
  ec->_M_value = 0;
  ec->_M_cat = peVar3;
  if (local_68._8_4_ == 2) {
    if (((uint)local_68._0_4_ < 2) ||
       (((local_68._0_4_ == 2 &&
         (bVar1 = equivalent(from,to,ec),
         (options & (update_existing|overwrite_existing|skip_existing)) != none)) && (!bVar1)))) {
      if ((options & update_existing) == none || (uint)local_68._0_4_ < 2) {
LAB_001579c5:
        __s = operator_new(0x4000);
        memset(__s,0,0x4000);
        iVar2 = open((from->_path)._M_dataplus._M_p,0);
        if (iVar2 < 0) {
          piVar6 = __errno_location();
          ec->_M_value = *piVar6;
          ec->_M_cat = peVar3;
          bVar1 = false;
        }
        else {
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
          this->_M_use_count = 1;
          this->_M_weak_count = 1;
          this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001bede8;
          *(int *)&this[1]._vptr__Sp_counted_base = iVar2;
          this[1]._M_use_count = 0;
          this[1]._M_weak_count = 0;
          __fd = open((to->_path)._M_dataplus._M_p,(uint)((uint)local_68._0_4_ < 2) << 7 | 0x241,
                      (ulong)(local_5c & 0x1ff));
          if (__fd < 0) {
            piVar6 = __errno_location();
            ec->_M_value = *piVar6;
            ec->_M_cat = peVar3;
            bVar1 = false;
          }
          else {
            local_58._0_8_ = peVar3;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
            this_00->_M_use_count = 1;
            this_00->_M_weak_count = 1;
            this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001bee38;
            *(int *)&this_00[1]._vptr__Sp_counted_base = __fd;
            this_00[1]._M_use_count = 0;
            this_00[1]._M_weak_count = 0;
            while( true ) {
              __n = read(iVar2,__s,0x4000);
              bVar1 = (long)__n < 1;
              if ((long)__n < 1) break;
              lVar8 = 0;
              do {
                sVar7 = write(__fd,(void *)((long)__s + lVar8),__n);
                if (sVar7 < 1) {
                  if (sVar7 < 0) {
                    piVar6 = __errno_location();
                    ec->_M_value = *piVar6;
                    ec->_M_cat = (error_category *)local_58._0_8_;
                    goto LAB_00157b05;
                  }
                }
                else {
                  __n = __n - sVar7;
                  lVar8 = lVar8 + sVar7;
                }
              } while (__n != 0);
            }
LAB_00157b05:
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        operator_delete(__s,0x4000);
        return bVar1;
      }
      fVar4 = last_write_time(from,ec);
      if ((ec->_M_value == 0) && (fVar5 = last_write_time(to,ec), ec->_M_value == 0)) {
        if ((long)fVar4.__d.__r <= (long)fVar5.__d.__r) {
          return false;
        }
        goto LAB_001579c5;
      }
      piVar6 = __errno_location();
      ec->_M_value = *piVar6;
    }
    else {
      iVar2 = 0x11;
      if (local_58._8_4_ != 0) {
        peVar3 = local_48;
        iVar2 = local_58._8_4_;
      }
      ec->_M_value = iVar2;
      *(undefined4 *)&ec->field_0x4 = local_58._12_4_;
    }
    ec->_M_cat = peVar3;
  }
  else {
    *(ulong *)ec = CONCAT44(local_40._4_4_,local_40._type);
    ec->_M_cat = peStack_38;
  }
  return false;
}

Assistant:

GHC_INLINE bool copy_file(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tecf, tect;
    auto sf = status(from, tecf);
    auto st = status(to, tect);
    bool overwrite = false;
    ec.clear();
    if (!is_regular_file(sf)) {
        ec = tecf;
        return false;
    }
    if (exists(st) && (!is_regular_file(st) || equivalent(from, to, ec) || (options & (copy_options::skip_existing | copy_options::overwrite_existing | copy_options::update_existing)) == copy_options::none)) {
        ec = tect ? tect : detail::make_error_code(detail::portable_error::exists);
        return false;
    }
    if (exists(st)) {
        if ((options & copy_options::update_existing) == copy_options::update_existing) {
            auto from_time = last_write_time(from, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            auto to_time = last_write_time(to, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            if (from_time <= to_time) {
                return false;
            }
        }
        overwrite = true;
    }
#ifdef GHC_OS_WINDOWS
    if (!::CopyFileW(detail::fromUtf8<std::wstring>(from.u8string()).c_str(), detail::fromUtf8<std::wstring>(to.u8string()).c_str(), !overwrite)) {
        ec = detail::make_system_error();
        return false;
    }
    return true;
#else
    std::vector<char> buffer(16384, '\0');
    int in = -1, out = -1;
    if ((in = ::open(from.c_str(), O_RDONLY)) < 0) {
        ec = detail::make_system_error();
        return false;
    }
    std::shared_ptr<void> guard_in(nullptr, [in](void*) { ::close(in); });
    int mode = O_CREAT | O_WRONLY | O_TRUNC;
    if (!overwrite) {
        mode |= O_EXCL;
    }
    if ((out = ::open(to.c_str(), mode, static_cast<int>(sf.permissions() & perms::all))) < 0) {
        ec = detail::make_system_error();
        return false;
    }
    std::shared_ptr<void> guard_out(nullptr, [out](void*) { ::close(out); });
    ssize_t br, bw;
    while ((br = ::read(in, buffer.data(), buffer.size())) > 0) {
        ssize_t offset = 0;
        do {
            if ((bw = ::write(out, buffer.data() + offset, static_cast<size_t>(br))) > 0) {
                br -= bw;
                offset += bw;
            }
            else if (bw < 0) {
                ec = detail::make_system_error();
                return false;
            }
        } while (br);
    }
    return true;
#endif
}